

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

predictor * __thiscall
Search::predictor::add_to<unsigned_int>
          (predictor *this,v_array<unsigned_int> *A,bool *A_is_ptr,uint a,bool clear_first)

{
  uint *__src;
  uint *puVar1;
  uint *__dest;
  size_t nmemb;
  uint local_34;
  
  local_34 = a;
  if (*A_is_ptr == true) {
    if (clear_first) {
      A->_end = A->_begin;
      nmemb = 1;
    }
    else {
      nmemb = ((long)A->_end - (long)A->_begin >> 2) + 1;
    }
    __src = A->_begin;
    puVar1 = A->_end;
    __dest = calloc_or_throw<unsigned_int>(nmemb);
    A->_begin = __dest;
    A->_end = __dest + nmemb;
    A->end_array = __dest + nmemb;
    memcpy(__dest,__src,(long)puVar1 - (long)__src);
    *A_is_ptr = false;
    A->_begin[nmemb - 1] = local_34;
  }
  else {
    if (clear_first) {
      v_array<unsigned_int>::clear(A);
    }
    v_array<unsigned_int>::push_back(A,&local_34);
  }
  return this;
}

Assistant:

predictor& predictor::add_to(v_array<T>& A, bool& A_is_ptr, T a, bool clear_first)
{
  if (A_is_ptr)  // we need to make our own memory
  {
    if (clear_first)
      A.end() = A.begin();
    size_t new_size = clear_first ? 1 : (A.size() + 1);
    make_new_pointer<T>(A, new_size);
    A_is_ptr = false;
    A[new_size - 1] = a;
  }
  else  // we've already allocated our own memory
  {
    if (clear_first)
      A.clear();
    A.push_back(a);
  }
  return *this;
}